

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int ffcalc_rng(fitsfile *infptr,char *expr,fitsfile *outfptr,char *parName,char *parInfo,int nRngs,
              long *start,long *end,int *status)

{
  char cVar1;
  bool bVar2;
  fitsfile *fptr;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  size_t sVar6;
  undefined4 uVar7;
  int *piVar8;
  long *naxes_00;
  long lVar9;
  char *pcVar10;
  LONGLONG value;
  ulong uVar11;
  anon_union_256_9_9da4f342_for_data *comm;
  ulong uVar12;
  int colNo;
  char tform [16];
  int naxis;
  char *local_280;
  uint local_274;
  ulong local_270;
  fitsfile *local_268;
  long nelem;
  char nullKwd [9];
  long totaln;
  int typecode;
  long width;
  long repeat;
  long naxes [5];
  parseInfo Info;
  ParseData lParse;
  char card [81];
  
  if (*status != 0) {
    return *status;
  }
  local_280 = parInfo;
  local_274 = nRngs;
  local_268 = outfptr;
  memset(&Info,0,0x90);
  iVar3 = ffiprs(infptr,0,expr,5,&Info.datatype,&nelem,&naxis,naxes,&lParse,status);
  lVar9 = nelem;
  if (iVar3 != 0) goto LAB_0012e633;
  if (nelem < 0) {
    nelem = -nelem;
  }
  piVar8 = &colNo;
  colNo = 0;
  local_270 = nelem;
  Info.parseData = &lParse;
  ffpmrk();
  fptr = local_268;
  ffgcno(local_268,0,parName,piVar8,status);
  ffcmsg();
  if (*status == 0) {
    ffkeyn("TDIM",colNo,tform,status);
    naxes_00 = (long *)status;
    ffgcrd(fptr,tform,card,status);
    pcVar10 = local_280;
    iVar3 = *status;
    if (iVar3 == 0xca) {
      *status = 0;
      ffcmsg();
      if (1 < naxis) goto LAB_0012e86c;
LAB_0012e87f:
      iVar3 = *status;
    }
    else if (iVar3 == 0) {
LAB_0012e86c:
      naxes_00 = naxes;
      ffptdm(fptr,colNo,naxis,naxes_00,status);
      goto LAB_0012e87f;
    }
    if (iVar3 != 0) goto LAB_0012e633;
LAB_0012e889:
    uVar7 = (undefined4)CONCAT71((int7)((ulong)naxes_00 >> 8),1);
  }
  else {
    *status = 0;
    if (*parName == '#') {
      if (-1 < lVar9) {
        ffcprs(&lParse);
        pcVar10 = "Cannot put tabular result into keyword (ffcalc)";
LAB_0012e8df:
        ffpmsg(pcVar10);
        *status = 0x1b0;
        return 0x1b0;
      }
      parName = parName + 1;
      iVar3 = fits_strcasecmp(parName,"HISTORY");
      if (((iVar3 == 0) || (iVar3 = fits_strcasecmp(parName,"COMMENT"), iVar3 == 0)) &&
         (Info.datatype != 0x10)) {
        ffcprs(&lParse);
        pcVar10 = "HISTORY and COMMENT values must be strings (ffcalc)";
        goto LAB_0012e8df;
      }
LAB_0012e957:
      uVar7 = (undefined4)CONCAT71((int7)((ulong)piVar8 >> 8),1);
      pcVar10 = local_280;
      if (colNo < 0) goto LAB_0012e757;
    }
    else {
      if ((lVar9 < 0) && (piVar8 = status, iVar3 = ffgcrd(fptr,parName,card,status), iVar3 != 0xca))
      {
        if (*status != 0) goto LAB_0012e633;
        goto LAB_0012e957;
      }
      colNo = -1;
LAB_0012e757:
      *status = 0;
      ffgncl(fptr,&colNo,status);
      pcVar10 = local_280;
      colNo = colNo + 1;
      if (local_280 == (char *)0x0) {
LAB_0012e7d5:
        if (lParse.hdutype == 2) {
          pcVar10 = tform;
          snprintf(pcVar10,0xf,"%ld",local_270);
          if (Info.datatype == 1) {
            pcVar10 = tform;
            sVar6 = strlen(pcVar10);
            (tform + sVar6)[0] = 'X';
            (tform + sVar6)[1] = '\0';
          }
          else if (Info.datatype == 0x52) {
            pcVar10 = tform;
            sVar6 = strlen(pcVar10);
            (tform + sVar6)[0] = 'D';
            (tform + sVar6)[1] = '\0';
          }
          else if (Info.datatype == 0x10) {
            pcVar10 = tform;
            sVar6 = strlen(pcVar10);
            (tform + sVar6)[0] = 'A';
            (tform + sVar6)[1] = '\0';
          }
          else if (Info.datatype == 0x29) {
            pcVar10 = tform;
            sVar6 = strlen(pcVar10);
            (tform + sVar6)[0] = 'J';
            (tform + sVar6)[1] = '\0';
          }
          else if (Info.datatype == 0x51) {
            pcVar10 = tform;
            sVar6 = strlen(pcVar10);
            (tform + sVar6)[0] = 'K';
            (tform + sVar6)[1] = '\0';
          }
          else if (Info.datatype == 0xe) {
            pcVar10 = tform;
            sVar6 = strlen(pcVar10);
            (tform + sVar6)[0] = 'L';
            (tform + sVar6)[1] = '\0';
          }
        }
        else if (Info.datatype == 1) {
LAB_0012e96f:
          pcVar10 = tform;
          snprintf(pcVar10,0x10,"A%ld",local_270);
        }
        else {
          pcVar10 = tform;
          if (Info.datatype == 0x52) {
            builtin_strncpy(tform,"D23.15",7);
          }
          else {
            if (Info.datatype == 0x10) goto LAB_0012e96f;
            if (Info.datatype == 0x29) {
              builtin_strncpy(tform,"I11",4);
            }
            else if (Info.datatype == 0xe) {
              ffcprs(&lParse);
              ffpmsg("Cannot create LOGICAL column in ASCII table");
              *status = 0xe3;
              return 0xe3;
            }
          }
        }
      }
      else {
        cVar1 = *local_280;
        if ((long)cVar1 == 0) goto LAB_0012e7d5;
        ppuVar5 = __ctype_b_loc();
        if (((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 8) == 0) && (lParse.hdutype == 2)) {
          uVar11 = local_270;
          if ((cVar1 == 'B') && (Info.datatype == 1)) {
            nelem = local_270 + 7 >> 3;
            uVar11 = nelem;
          }
          pcVar10 = tform;
          snprintf(pcVar10,0x10,"%ld%s",uVar11,local_280);
        }
      }
      fficol(fptr,colNo,parName,pcVar10,status);
      if (1 < naxis) {
        ffptdm(fptr,colNo,naxis,naxes,status);
      }
      ffkeyn("TNULL",colNo,nullKwd,status);
      piVar8 = status;
      iVar3 = ffgcrd(fptr,nullKwd,card,status);
      uVar7 = (undefined4)CONCAT71((int7)((ulong)piVar8 >> 8),1);
      if (iVar3 == 0xca) {
        *status = 0;
        if (lParse.hdutype == 1) {
          ffpkys(fptr,nullKwd,"NULL","Null value string",status);
          ffsnul(fptr,colNo,"NULL",status);
        }
        else {
          if (lParse.hdutype != 2) goto LAB_0012ebaf;
          naxes_00 = &width;
          ffbnfm(pcVar10,&typecode,&repeat,naxes_00,status);
          if (typecode == 0xb) {
            value = 0xff;
          }
          else if (typecode == 0x51) {
            value = -0x8000000000000000;
          }
          else if ((typecode == 0x1f) || (typecode == 0x29)) {
            value = -0x80000000;
          }
          else {
            if (typecode != 0x15) goto LAB_0012e889;
            value = -0x8000;
          }
          ffpkyj(fptr,nullKwd,value,"Null value",status);
          fftnul(fptr,colNo,value,status);
        }
        uVar7 = 0;
      }
    }
  }
LAB_0012ebaf:
  if (0 < colNo) {
    local_280 = (char *)CONCAT44(local_280._4_4_,uVar7);
    bVar2 = false;
    ffgkyj(infptr,"NAXIS2",&totaln,(char *)0x0,status);
    iVar3 = lParse.nCols;
    iVar4 = fits_parser_allocateCol(&lParse,lParse.nCols,status);
    if (iVar4 == 0) {
      fits_iter_set_by_num(lParse.colData + iVar3,local_268,colNo,0,2);
      lParse.nCols = lParse.nCols + 1;
      uVar11 = 0;
      if (0 < (int)local_274) {
        uVar11 = (ulong)local_274;
      }
      for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        Info.dataPtr = (void *)0x0;
        lVar9 = end[uVar12] - start[uVar12];
        Info.maxRows = lVar9 + 1;
        if ((((local_274 == 1) && (8 < lVar9)) && (*start == 1)) && (*end == totaln)) {
          lVar9 = 0;
        }
        else {
          lVar9 = (long)(int)Info.maxRows;
        }
        iVar3 = ffiter(lParse.nCols,lParse.colData,start[uVar12] + -1,lVar9,fits_parser_workfn,&Info
                       ,status);
        if (iVar3 == -1) {
          *status = 0;
        }
        else if (*status != 0) goto LAB_0012e633;
        if (Info.anyNull != 0) {
          bVar2 = true;
        }
      }
      if ((char)local_280 == '\0' && !bVar2) {
        ffdkey(local_268,nullKwd,status);
      }
    }
    goto LAB_0012e633;
  }
  if (Info.datatype != 1) {
    if (Info.datatype == 0xe) {
      ffukyl(fptr,parName,(int)lParse.Nodes[lParse.resultNode].value.data.log,pcVar10,status);
      goto LAB_0012e633;
    }
    if (Info.datatype != 0x10) {
      if (Info.datatype == 0x29) {
        ffukyj(fptr,parName,lParse.Nodes[lParse.resultNode].value.data.lng,pcVar10,status);
      }
      else if (Info.datatype == 0x52) {
        ffukyd(fptr,parName,lParse.Nodes[lParse.resultNode].value.data.dbl,0xf,pcVar10,status);
      }
      goto LAB_0012e633;
    }
  }
  iVar3 = fits_strcasecmp(parName,"HISTORY");
  if (iVar3 == 0) {
    ffphis(fptr,&lParse.Nodes[lParse.resultNode].value.data.log,status);
  }
  else {
    iVar3 = fits_strcasecmp(parName,"COMMENT");
    comm = &lParse.Nodes[lParse.resultNode].value.data;
    if (iVar3 == 0) {
      ffpcom(fptr,&comm->log,status);
    }
    else {
      ffukys(fptr,parName,&comm->log,pcVar10,status);
    }
  }
LAB_0012e633:
  ffcprs(&lParse);
  return *status;
}

Assistant:

int ffcalc_rng( fitsfile *infptr,   /* I - Input FITS file                  */
                char     *expr,     /* I - Arithmetic expression            */
                fitsfile *outfptr,  /* I - Output fits file                 */
                char     *parName,  /* I - Name of output parameter         */
                char     *parInfo,  /* I - Extra information on parameter   */
                int      nRngs,     /* I - Row range info                   */
                long     *start,    /* I - Row range info                   */
                long     *end,      /* I - Row range info                   */
                int      *status )  /* O - Error status                     */
/*                                                                          */
/* Evaluate an expression using the data in the input FITS file and place   */
/* the results into either a column or keyword in the output fits file,     */
/* depending on the value of parName (keywords normally prefixed with '#')  */
/* and whether the expression evaluates to a constant or a table column.    */
/* The logic is as follows:                                                 */
/*    (1) If a column exists with name, parName, put results there.         */
/*    (2) If parName starts with '#', as in #NAXIS, put result there,       */
/*        with parInfo used as the comment. If expression does not evaluate */
/*        to a constant, flag an error.                                     */
/*    (3) If a keyword exists with name, parName, and expression is a       */
/*        constant, put result there, using parInfo as the new comment.     */
/*    (4) Else, create a new column with name parName and TFORM parInfo.    */
/*        If parInfo is NULL, use a default data type for the column.       */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant, typecode, newNullKwd=0;
   long nelem, naxes[MAXDIMS], repeat, width;
   int col_cnt, colNo;
   Node *result;
   char card[81], tform[16], nullKwd[9], tdimKwd[9];
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( infptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {

      ffcprs(&lParse);
      return( *status );
   }
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   Info.parseData = &lParse;
   /*  Case (1): If column exists put it there  */

   colNo = 0;
   ffpmrk(); /* prevent lack of column name from sullying the stack */
   ffgcno( outfptr, CASEINSEN, parName, &colNo, status );
   ffcmsg();   
   if( *status ) {

      /*  Output column doesn't exist.  Test for keyword. */

      /* Case (2): Does parName indicate result should be put into keyword */

      *status = 0;
      if( parName[0]=='#' ) {
         if( ! constant ) {
            ffcprs(&lParse);
            ffpmsg( "Cannot put tabular result into keyword (ffcalc)" );
            return( *status = PARSE_BAD_TYPE );
         }
         parName++;  /* Advance past '#' */
	 if ( (fits_strcasecmp(parName,"HISTORY") == 0 || fits_strcasecmp(parName,"COMMENT") == 0) &&
	      Info.datatype != TSTRING ) {
            ffcprs(&lParse);
            ffpmsg( "HISTORY and COMMENT values must be strings (ffcalc)" );
	    return( *status = PARSE_BAD_TYPE );
	 }

      } else if( constant ) {

         /* Case (3): Does a keyword named parName already exist */

         if( ffgcrd( outfptr, parName, card, status )==KEY_NO_EXIST ) {
            colNo = -1;
         } else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }

      } else
         colNo = -1;

      if( colNo<0 ) {

         /* Case (4): Create new column */

         *status = 0;
         ffgncl( outfptr, &colNo, status );
         colNo++;
         if( parInfo==NULL || *parInfo=='\0' ) {
            /*  Figure out best default column type  */
            if( lParse.hdutype==BINARY_TBL ) {
               snprintf(tform,15,"%ld",nelem);
               switch( Info.datatype ) {
               case TLOGICAL:  strcat(tform,"L");  break;
               case TLONG:     strcat(tform,"J");  break;
               case TDOUBLE:   strcat(tform,"D");  break;
               case TSTRING:   strcat(tform,"A");  break;
               case TBIT:      strcat(tform,"X");  break;
               case TLONGLONG: strcat(tform,"K");  break;
               }
            } else {
               switch( Info.datatype ) {
               case TLOGICAL:
                  ffcprs(&lParse);
                  ffpmsg("Cannot create LOGICAL column in ASCII table");
                  return( *status = NOT_BTABLE );
               case TLONG:     strcpy(tform,"I11");     break;
               case TDOUBLE:   strcpy(tform,"D23.15");  break;
               case TSTRING:   
               case TBIT:      snprintf(tform,16,"A%ld",nelem);  break;
               }
            }
            parInfo = tform;
         } else if( !(isdigit((int) *parInfo)) && lParse.hdutype==BINARY_TBL ) {
            if( Info.datatype==TBIT && *parInfo=='B' )
               nelem = (nelem+7)/8;
            snprintf(tform,16,"%ld%s",nelem,parInfo);
            parInfo = tform;
         }
         fficol( outfptr, colNo, parName, parInfo, status );
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );

         /*  Setup TNULLn keyword in case NULLs are encountered  */

         ffkeyn("TNULL", colNo, nullKwd, status);
         if( ffgcrd( outfptr, nullKwd, card, status )==KEY_NO_EXIST ) {
            *status = 0;
            if( lParse.hdutype==BINARY_TBL ) {
	       LONGLONG nullVal=0;
               fits_binary_tform( parInfo, &typecode, &repeat, &width, status );
               if( typecode==TBYTE )
                  nullVal = UCHAR_MAX;
               else if( typecode==TSHORT )
                  nullVal = SHRT_MIN;
               else if( typecode==TINT )
                  nullVal = INT_MIN;
               else if( typecode==TLONG ) {
                  if (sizeof(long) == 8 && sizeof(int) == 4)
                     nullVal = INT_MIN;
                  else
                     nullVal = LONG_MIN;
               }
               else if( typecode==TLONGLONG )
                  nullVal = LONGLONG_MIN;
		  
               if( nullVal ) {
                  ffpkyj( outfptr, nullKwd, nullVal, "Null value", status );
                  fits_set_btblnull( outfptr, colNo, nullVal, status );
                  newNullKwd = 1;
               }
            } else if( lParse.hdutype==ASCII_TBL ) {
               ffpkys( outfptr, nullKwd, "NULL", "Null value string", status );
               fits_set_atblnull( outfptr, colNo, "NULL", status );
               newNullKwd = 1;
            }
         }

      }

   } else if( *status ) {
      ffcprs(&lParse);
      return( *status );
   } else {

      /********************************************************/
      /*  Check if a TDIM keyword should be written/updated.  */
      /********************************************************/

      ffkeyn("TDIM", colNo, tdimKwd, status);
      ffgcrd( outfptr, tdimKwd, card, status );
      if( *status==0 ) {
         /*  TDIM exists, so update it with result's dimension  */
         ffptdm( outfptr, colNo, naxis, naxes, status );
      } else if( *status==KEY_NO_EXIST ) {
         /*  TDIM does not exist, so clear error stack and     */
         /*  write a TDIM only if result is multi-dimensional  */
         *status = 0;
         ffcmsg();
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );
      }
      if( *status ) {
         /*  Either some other error happened in ffgcrd   */
         /*  or one happened in ffptdm                    */
         ffcprs(&lParse);
         return( *status );
      }

   }

   if( colNo>0 ) {

      /*  Output column exists (now)... put results into it  */

      int anyNull = 0;
      int nPerLp, i;
      long totaln;

      ffgkyj(infptr, "NAXIS2", &totaln, 0, status);

      /*************************************/
      /* Create new iterator Output Column */
      /*************************************/

      col_cnt = lParse.nCols;
      if( fits_parser_allocateCol( &lParse, col_cnt, status ) ) {
         ffcprs(&lParse);
         return( *status );
      }

      fits_iter_set_by_num( lParse.colData+col_cnt, outfptr,
                            colNo, 0, OutputCol );
      lParse.nCols++;

      for( i=0; i<nRngs; i++ ) {
         Info.dataPtr = NULL;
         Info.maxRows = end[i]-start[i]+1;

          /*
            If there is only 1 range, and it includes all the rows,
            and there are 10 or more rows, then set nPerLp = 0 so
            that the iterator function will dynamically choose the
            most efficient number of rows to process in each loop.
            Otherwise, set nPerLp to the number of rows in this range.
         */

         if( (Info.maxRows >= 10) && (nRngs == 1) &&
             (start[0] == 1) && (end[0] == totaln))
              nPerLp = 0;
         else
              nPerLp = Info.maxRows;

         if( ffiter( lParse.nCols, lParse.colData, start[i]-1,
                     nPerLp, fits_parser_workfn, (void*)&Info, status ) == -1 )
            *status = 0;
         else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }
         if( Info.anyNull ) anyNull = 1;
      }

      if( newNullKwd && !anyNull ) {
         ffdkey( outfptr, nullKwd, status );
      }

   } else {

      /* Put constant result into keyword */

      result  = lParse.Nodes + lParse.resultNode;
      switch( Info.datatype ) {
      case TDOUBLE:
         ffukyd( outfptr, parName, result->value.data.dbl, 15,
                 parInfo, status );
         break;
      case TLONG:
         ffukyj( outfptr, parName, result->value.data.lng, parInfo, status );
         break;
      case TLOGICAL:
         ffukyl( outfptr, parName, result->value.data.log, parInfo, status );
         break;
      case TBIT:
      case TSTRING:
	 if (fits_strcasecmp(parName,"HISTORY") == 0) {
	   ffphis( outfptr, result->value.data.str, status);
	 } else if (fits_strcasecmp(parName,"COMMENT") == 0) {
	   ffpcom( outfptr, result->value.data.str, status);
	 } else {
	   ffukys( outfptr, parName, result->value.data.str, parInfo, status );
	 }
         break;
      }
   }

   ffcprs(&lParse);
   return( *status );
}